

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection_manager.cpp
# Opt level: O0

void __thiscall
duckdb::ConnectionManager::AddConnection(ConnectionManager *this,ClientContext *context)

{
  bool bVar1;
  DBConfig *this_00;
  pointer pEVar2;
  unordered_map<std::reference_wrapper<duckdb::ClientContext>,_duckdb::weak_ptr<duckdb::ClientContext,_true>,_duckdb::ReferenceHashFunction<duckdb::ClientContext>,_duckdb::ReferenceEquality<duckdb::ClientContext>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::ClientContext>,_duckdb::weak_ptr<duckdb::ClientContext,_true>_>_>_>
  *this_01;
  mapped_type *this_02;
  undefined8 in_RSI;
  long in_RDI;
  unique_ptr<duckdb::ExtensionCallback,_std::default_delete<duckdb::ExtensionCallback>,_true>
  *callback;
  iterator __end1;
  iterator __begin1;
  vector<duckdb::unique_ptr<duckdb::ExtensionCallback,_std::default_delete<duckdb::ExtensionCallback>,_true>,_true>
  *__range1;
  lock_guard<std::mutex> lock;
  ClientContext *in_stack_ffffffffffffff58;
  weak_ptr<duckdb::ClientContext,_true> *in_stack_ffffffffffffff60;
  weak_ptr<duckdb::ClientContext,_true> *this_03;
  weak_ptr<duckdb::ClientContext,_true> local_70 [2];
  reference local_48;
  unique_ptr<duckdb::ExtensionCallback,_std::default_delete<duckdb::ExtensionCallback>,_true>
  *local_40;
  __normal_iterator<duckdb::unique_ptr<duckdb::ExtensionCallback,_std::default_delete<duckdb::ExtensionCallback>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::ExtensionCallback,_std::default_delete<duckdb::ExtensionCallback>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ExtensionCallback,_std::default_delete<duckdb::ExtensionCallback>,_true>_>_>_>
  local_38 [3];
  vector<duckdb::unique_ptr<duckdb::ExtensionCallback,_std::default_delete<duckdb::ExtensionCallback>,_true>,_true>
  *local_20;
  undefined8 local_10;
  
  local_10 = in_RSI;
  ::std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)in_stack_ffffffffffffff60,
             (mutex_type *)in_stack_ffffffffffffff58);
  this_00 = DBConfig::GetConfig((ClientContext *)0x877e9e);
  local_20 = &this_00->extension_callbacks;
  local_38[0]._M_current =
       (unique_ptr<duckdb::ExtensionCallback,_std::default_delete<duckdb::ExtensionCallback>,_true>
        *)::std::
          vector<duckdb::unique_ptr<duckdb::ExtensionCallback,_std::default_delete<duckdb::ExtensionCallback>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ExtensionCallback,_std::default_delete<duckdb::ExtensionCallback>,_true>_>_>
          ::begin((vector<duckdb::unique_ptr<duckdb::ExtensionCallback,_std::default_delete<duckdb::ExtensionCallback>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ExtensionCallback,_std::default_delete<duckdb::ExtensionCallback>,_true>_>_>
                   *)in_stack_ffffffffffffff58);
  local_40 = (unique_ptr<duckdb::ExtensionCallback,_std::default_delete<duckdb::ExtensionCallback>,_true>
              *)::std::
                vector<duckdb::unique_ptr<duckdb::ExtensionCallback,_std::default_delete<duckdb::ExtensionCallback>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ExtensionCallback,_std::default_delete<duckdb::ExtensionCallback>,_true>_>_>
                ::end((vector<duckdb::unique_ptr<duckdb::ExtensionCallback,_std::default_delete<duckdb::ExtensionCallback>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ExtensionCallback,_std::default_delete<duckdb::ExtensionCallback>,_true>_>_>
                       *)in_stack_ffffffffffffff58);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<duckdb::unique_ptr<duckdb::ExtensionCallback,_std::default_delete<duckdb::ExtensionCallback>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::ExtensionCallback,_std::default_delete<duckdb::ExtensionCallback>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ExtensionCallback,_std::default_delete<duckdb::ExtensionCallback>,_true>_>_>_>
                        *)in_stack_ffffffffffffff60,
                       (__normal_iterator<duckdb::unique_ptr<duckdb::ExtensionCallback,_std::default_delete<duckdb::ExtensionCallback>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::ExtensionCallback,_std::default_delete<duckdb::ExtensionCallback>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ExtensionCallback,_std::default_delete<duckdb::ExtensionCallback>,_true>_>_>_>
                        *)in_stack_ffffffffffffff58);
    if (!bVar1) break;
    local_48 = __gnu_cxx::
               __normal_iterator<duckdb::unique_ptr<duckdb::ExtensionCallback,_std::default_delete<duckdb::ExtensionCallback>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::ExtensionCallback,_std::default_delete<duckdb::ExtensionCallback>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ExtensionCallback,_std::default_delete<duckdb::ExtensionCallback>,_true>_>_>_>
               ::operator*(local_38);
    pEVar2 = unique_ptr<duckdb::ExtensionCallback,_std::default_delete<duckdb::ExtensionCallback>,_true>
             ::operator->((unique_ptr<duckdb::ExtensionCallback,_std::default_delete<duckdb::ExtensionCallback>,_true>
                           *)in_stack_ffffffffffffff60);
    (**(code **)(*(long *)pEVar2 + 0x10))(pEVar2,local_10);
    __gnu_cxx::
    __normal_iterator<duckdb::unique_ptr<duckdb::ExtensionCallback,_std::default_delete<duckdb::ExtensionCallback>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::ExtensionCallback,_std::default_delete<duckdb::ExtensionCallback>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ExtensionCallback,_std::default_delete<duckdb::ExtensionCallback>,_true>_>_>_>
    ::operator++(local_38);
  }
  enable_shared_from_this<duckdb::ClientContext>::shared_from_this
            ((enable_shared_from_this<duckdb::ClientContext> *)this_00);
  weak_ptr<duckdb::ClientContext,_true>::weak_ptr<duckdb::ClientContext,_0>
            (in_stack_ffffffffffffff60,
             (shared_ptr<duckdb::ClientContext,_true> *)in_stack_ffffffffffffff58);
  this_01 = (unordered_map<std::reference_wrapper<duckdb::ClientContext>,_duckdb::weak_ptr<duckdb::ClientContext,_true>,_duckdb::ReferenceHashFunction<duckdb::ClientContext>,_duckdb::ReferenceEquality<duckdb::ClientContext>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::ClientContext>,_duckdb::weak_ptr<duckdb::ClientContext,_true>_>_>_>
             *)(in_RDI + 0x28);
  this_03 = local_70;
  ::std::reference_wrapper<duckdb::ClientContext>::
  reference_wrapper<duckdb::ClientContext&,void,duckdb::ClientContext*>
            ((reference_wrapper<duckdb::ClientContext> *)this_01,in_stack_ffffffffffffff58);
  this_02 = ::std::
            unordered_map<std::reference_wrapper<duckdb::ClientContext>,_duckdb::weak_ptr<duckdb::ClientContext,_true>,_duckdb::ReferenceHashFunction<duckdb::ClientContext>,_duckdb::ReferenceEquality<duckdb::ClientContext>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::ClientContext>,_duckdb::weak_ptr<duckdb::ClientContext,_true>_>_>_>
            ::operator[](this_01,(key_type *)in_stack_ffffffffffffff58);
  weak_ptr<duckdb::ClientContext,_true>::operator=
            (this_03,(weak_ptr<duckdb::ClientContext,_true> *)this_01);
  weak_ptr<duckdb::ClientContext,_true>::~weak_ptr
            ((weak_ptr<duckdb::ClientContext,_true> *)0x877fc6);
  shared_ptr<duckdb::ClientContext,_true>::~shared_ptr
            ((shared_ptr<duckdb::ClientContext,_true> *)0x877fd0);
  ::std::
  unordered_map<std::reference_wrapper<duckdb::ClientContext>,_duckdb::weak_ptr<duckdb::ClientContext,_true>,_duckdb::ReferenceHashFunction<duckdb::ClientContext>,_duckdb::ReferenceEquality<duckdb::ClientContext>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::ClientContext>,_duckdb::weak_ptr<duckdb::ClientContext,_true>_>_>_>
  ::size((unordered_map<std::reference_wrapper<duckdb::ClientContext>,_duckdb::weak_ptr<duckdb::ClientContext,_true>,_duckdb::ReferenceHashFunction<duckdb::ClientContext>,_duckdb::ReferenceEquality<duckdb::ClientContext>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::ClientContext>,_duckdb::weak_ptr<duckdb::ClientContext,_true>_>_>_>
          *)0x877fde);
  ::std::__atomic_base<unsigned_long>::operator=
            ((__atomic_base<unsigned_long> *)this_02,(__int_type)this_03);
  ::std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x877ffc);
  return;
}

Assistant:

void ConnectionManager::AddConnection(ClientContext &context) {
	lock_guard<mutex> lock(connections_lock);
	for (auto &callback : DBConfig::GetConfig(context).extension_callbacks) {
		callback->OnConnectionOpened(context);
	}
	connections[context] = weak_ptr<ClientContext>(context.shared_from_this());
	connection_count = connections.size();
}